

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterConversion.h
# Opt level: O2

void PixelToaster::convert_XBGRFFFF_to_XBGR8888(Pixel *source,integer32 *destination,uint count)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  float fVar5;
  
  for (lVar4 = 0; (ulong)count << 2 != lVar4; lVar4 = lVar4 + 4) {
    fVar5 = (float)(~((int)(&source->r)[lVar4] >> 0x1f) & (uint)(&source->r)[lVar4]);
    uVar1 = (uint)(fVar5 + 1.0) >> 0xf & 0xff;
    if (0x3f7ffffe < (int)fVar5) {
      uVar1 = 0xff;
    }
    fVar5 = (float)(~((int)(&source->g)[lVar4] >> 0x1f) & (uint)(&source->g)[lVar4]);
    uVar2 = (uint)(fVar5 + 1.0) >> 7 & 0xff00;
    if (0x3f7ffffe < (int)fVar5) {
      uVar2 = 0xff00;
    }
    fVar5 = (float)(~((int)(&source->b)[lVar4] >> 0x1f) & (uint)(&source->b)[lVar4]);
    uVar3 = (int)(fVar5 + 1.0) * 2 & 0xff0000;
    if (0x3f7ffffe < (int)fVar5) {
      uVar3 = 0xff0000;
    }
    *(uint *)((long)destination + lVar4) = uVar2 | uVar1 | uVar3;
  }
  return;
}

Assistant:

inline void convert_XBGRFFFF_to_XBGR8888(const Pixel source[], integer32 destination[], unsigned int count)
{
    for (unsigned int i = 0; i < count; ++i)
    {
        const integer32 r = clamped_fraction_8(source[i].r) >> 15;
        const integer32 g = clamped_fraction_8(source[i].g) >> 7;
        const integer32 b = clamped_fraction_8(source[i].b) << 1;

        destination[i] = r | g | b;
    }
}